

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCompiler.cpp
# Opt level: O0

bool __thiscall Refal2::CLeftPartCompiler::tryMatchRightVariable(CLeftPartCompiler *this)

{
  TVariableIndex variableIndex;
  bool bVar1;
  TVariableType TVar2;
  CNodeType *pCVar3;
  TVariableIndex *pTVar4;
  CVariable *pCVar5;
  TVariableIndex variable;
  CLeftPartCompiler *this_local;
  
  pCVar3 = CNodeList<Refal2::CUnit>::GetLast((CNodeList<Refal2::CUnit> *)this->hole);
  bVar1 = CUnit::IsVariable(&pCVar3->super_CUnit);
  if (!bVar1) {
    __assert_fail("hole->GetLast()->IsVariable()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/FunctionCompiler.cpp"
                  ,0x135,"bool Refal2::CLeftPartCompiler::tryMatchRightVariable()");
  }
  pCVar3 = CNodeList<Refal2::CUnit>::GetLast((CNodeList<Refal2::CUnit> *)this->hole);
  pTVar4 = CUnit::Variable(&pCVar3->super_CUnit);
  variableIndex = *pTVar4;
  bVar1 = CVariables::IsSet(&(this->super_CFunctionCompilerBase).variables,variableIndex);
  if (bVar1) {
    pCVar5 = CVariables::GetVariable(&(this->super_CFunctionCompilerBase).variables,variableIndex);
    TVar2 = CVariable::GetType(pCVar5);
    switch(TVar2) {
    case VT_None:
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/FunctionCompiler.cpp"
                    ,0x149,"bool Refal2::CLeftPartCompiler::tryMatchRightVariable()");
    case VT_S:
      matchDuplicateVariable(this,variableIndex,0x158720);
      break;
    case VT_W:
    case VT_V:
      matchDuplicateVariable(this,variableIndex,0x1588a0);
      break;
    case VT_E:
      matchDuplicateVariable(this,variableIndex,0x158920);
    }
  }
  else {
    pCVar5 = CVariables::GetVariable(&(this->super_CFunctionCompilerBase).variables,variableIndex);
    TVar2 = CVariable::GetType(pCVar5);
    switch(TVar2) {
    case VT_None:
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/FunctionCompiler.cpp"
                    ,0x15b,"bool Refal2::CLeftPartCompiler::tryMatchRightVariable()");
    case VT_S:
      matchVariable(this,variableIndex,0x158660);
      break;
    case VT_W:
      matchVariable(this,variableIndex,0x1587e0);
      break;
    case VT_V:
    case VT_E:
      return false;
    }
  }
  CNodeList<Refal2::CUnit>::RemoveLast((CNodeList<Refal2::CUnit> *)this->hole);
  return true;
}

Assistant:

bool CLeftPartCompiler::tryMatchRightVariable()
{
	assert( hole->GetLast()->IsVariable() );
	const TVariableIndex variable = hole->GetLast()->Variable();
	if( variables.IsSet( variable ) ) {
		// match duplicate
		switch( variables.GetVariable( variable ).GetType() ) {
			case VT_S:
				matchDuplicateVariable( variable,
					&COperationsBuilder::AddMatchRightDuplicate_S );
				break;
			case VT_W:
			case VT_V:
				matchDuplicateVariable( variable,
					&COperationsBuilder::AddMatchRightDuplicate_WV );
				break;
			case VT_E:
				matchDuplicateVariable( variable,
					&COperationsBuilder::AddMatchRightDuplicate_E );
				break;
			case VT_None:
			default:
				assert( false );
				break;
		}
	} else {
		switch( variables.GetVariable( variable ).GetType() ) {
			case VT_S:
				matchVariable( variable,
					&COperationsBuilder::AddMatchRight_S );
				break;
			case VT_W:
				matchVariable( variable,
					&COperationsBuilder::AddMatchRight_W );
				break;
			case VT_V:
			case VT_E:
				return false;
			case VT_None:
			default:
				assert( false );
				break;
		}
	}
	hole->RemoveLast();
	return true;
}